

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::ByteSize(CodeGeneratorResponse_File *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  UnknownFieldSet *pUVar4;
  int local_14;
  int total_size;
  CodeGeneratorResponse_File *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar3 = name_abi_cxx11_(this);
      local_14 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = local_14 + 1;
    }
    bVar1 = has_insertion_point(this);
    if (bVar1) {
      psVar3 = insertion_point_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_content(this);
    if (bVar1) {
      psVar3 = content_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int CodeGeneratorResponse_File::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string insertion_point = 2;
    if (has_insertion_point()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->insertion_point());
    }

    // optional string content = 15;
    if (has_content()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->content());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}